

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  ulong size_00;
  size_t size_01;
  double dVar1;
  long lVar2;
  long lVar3;
  LhsScalar *pLVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long depth;
  long depth_00;
  long lVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  long j;
  long lVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  long i3;
  double *pdVar26;
  long lVar27;
  double dVar28;
  double local_1b8;
  ptrdiff_t l1;
  ptrdiff_t l3;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  ptrdiff_t l2;
  long startTarget;
  double *local_d8;
  long local_c8;
  double *local_c0;
  long actual_kc;
  long local_58;
  LhsScalar *local_50;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_41;
  long lStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  local_31 [7];
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  
  pdVar5 = &local_1b8;
  if (otherIncr == 1) {
    lVar2 = blocking->m_kc;
    lVar24 = blocking->m_mc;
    if (size <= blocking->m_mc) {
      lVar24 = size;
    }
    pdVar25 = (double *)(lVar24 * lVar2);
    lStack_40 = size;
    if ((ulong)pdVar25 >> 0x3d != 0) {
      throw_std_bad_alloc();
    }
    pdVar26 = (double *)(lVar2 * otherSize);
    local_50 = blocking->m_blockA;
    size_00 = (long)pdVar25 * 8;
    if (local_50 == (LhsScalar *)0x0) {
      if (size_00 < 0x20001) {
        l3 = (long)&local_1b8 - (size_00 + 0x1e & 0xfffffffffffffff0);
        blockA_stack_memory_destructor.m_size._0_1_ = false;
        pdVar5 = (double *)l3;
        local_50 = (LhsScalar *)l3;
      }
      else {
        local_50 = (LhsScalar *)aligned_malloc(size_00);
        l3 = (ptrdiff_t)(LhsScalar *)0x0;
        if (blocking->m_blockA == (LhsScalar *)0x0) {
          l3 = (ptrdiff_t)local_50;
        }
        blockA_stack_memory_destructor.m_size._0_1_ = true;
      }
    }
    else {
      blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
      l3 = 0;
      pdVar5 = &local_1b8;
    }
    blockA_stack_memory_destructor.m_ptr = pdVar25;
    if ((double *)0x1fffffffffffffff < pdVar26) {
      pdVar5[-1] = 6.78116462426965e-318;
      throw_std_bad_alloc();
    }
    size_01 = (long)pdVar26 * 8;
    if (blocking->m_blockB == (double *)0x0) {
      if (size_01 < 0x20001) {
        pdVar5 = (double *)((long)pdVar5 - (size_01 + 0x1e & 0xfffffffffffffff0));
        blockA_stack_memory_destructor._16_8_ = pdVar5;
        pdVar25 = pdVar5;
      }
      else {
        pdVar5[-1] = 6.78146600431362e-318;
        pdVar25 = (double *)aligned_malloc(size_01);
        blockA_stack_memory_destructor._16_8_ = (double *)0x0;
        if (blocking->m_blockB == (RhsScalar *)0x0) {
          blockA_stack_memory_destructor._16_8_ = pdVar25;
        }
      }
    }
    else {
      blockA_stack_memory_destructor._16_8_ = (double *)0x0;
      pdVar25 = blocking->m_blockB;
    }
    blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_01;
    blockB_stack_memory_destructor.m_ptr = pdVar26;
    pdVar5[-1] = 6.7818118502657e-318;
    manage_caching_sizes
              (GetAction,(ptrdiff_t *)&local_1b8,
               (ptrdiff_t *)&blockB_stack_memory_destructor.m_deallocate,&l1);
    pdVar5[-1] = 1.97626258336499e-323;
    depth_00 = (long)pdVar5[-1];
    if (otherSize < 1) {
      lVar17 = 0;
    }
    else {
      lVar17 = lStack_40;
      if (lStack_40 < otherStride) {
        lVar17 = otherStride;
      }
      lVar17 = (long)((ulong)blockB_stack_memory_destructor._16_8_ / (ulong)(lVar17 << 5)) /
               depth_00 << 2;
    }
    if (lVar17 < 5) {
      lVar17 = depth_00;
    }
    pdVar26 = _other + lStack_40;
    local_d8 = _tri + (lStack_40 + -1) * triStride + lStack_40;
    local_c8 = lStack_40 - lVar2;
    local_c0 = _tri + triStride * local_c8;
    lVar14 = lStack_40;
    while( true ) {
      depth = lVar14;
      if (lVar2 < lVar14) {
        depth = lVar2;
      }
      if (lVar14 < 1) break;
      lStack_40 = lVar14;
      pdVar10 = pdVar26;
      for (lVar13 = 0; lVar6 = otherSize - lVar13, lVar6 != 0 && lVar13 <= otherSize;
          lVar13 = lVar13 + lVar17) {
        if (lVar17 < lVar6) {
          lVar6 = lVar17;
        }
        lVar19 = 0;
        lVar8 = depth;
        pdVar11 = local_d8;
        pdVar20 = pdVar10;
        while( true ) {
          lVar9 = depth_00;
          if (lVar8 < 4) {
            lVar9 = lVar8;
          }
          lVar7 = 0;
          if (0 < lVar9) {
            lVar7 = lVar9;
          }
          lVar22 = depth - lVar19;
          if (lVar22 == 0 || depth < lVar19) break;
          lVar3 = -lVar9;
          pdVar12 = pdVar11 + -lVar9;
          if (lVar22 < 4) {
            depth_00 = lVar22;
          }
          lVar15 = 0;
          while( true ) {
            lVar9 = lVar9 + -1;
            lVar16 = 0;
            if (0 < lVar9) {
              lVar16 = lVar9;
            }
            if (lVar15 == lVar7) break;
            lVar18 = ~(lVar19 + lVar15) + lStack_40;
            dVar1 = _tri[lVar18 * triStride + lVar18];
            pdVar21 = pdVar20 + lVar3;
            for (lVar23 = lVar13; lVar23 < lVar6 + lVar13; lVar23 = lVar23 + 1) {
              dVar28 = _other[lVar23 * otherStride + lVar18] * (1.0 / dVar1);
              _other[lVar23 * otherStride + lVar18] = dVar28;
              for (lVar27 = 0; lVar16 != lVar27; lVar27 = lVar27 + 1) {
                pdVar21[lVar27] = pdVar12[lVar27] * -dVar28 + pdVar21[lVar27];
              }
              pdVar21 = pdVar21 + otherStride;
            }
            lVar15 = lVar15 + 1;
            pdVar12 = pdVar12 + -triStride;
          }
          lVar22 = lVar22 - depth_00;
          lVar9 = (lStack_40 - lVar19) - depth_00;
          actual_kc = (long)(_other + lVar13 * otherStride + lVar9);
          local_58 = otherStride;
          pdVar5[-2] = (double)lVar22;
          pdVar5[-3] = 6.78616456860557e-318;
          gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
          ::operator()(&local_41,pdVar25 + lVar13 * depth,
                       (blas_data_mapper<double,_long,_0,_0,_1> *)&actual_kc,depth_00,lVar6,depth,
                       (long)pdVar5[-2]);
          pLVar4 = local_50;
          if (0 < lVar22) {
            actual_kc = (long)(_tri + (lVar14 - depth) + lVar9 * triStride);
            local_58 = triStride;
            pdVar5[-2] = 0.0;
            pdVar5[-3] = 6.78661416834328e-318;
            gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
            ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&actual_kc,
                         depth_00,lVar22,0,(long)pdVar5[-2]);
            pLVar4 = local_50;
            actual_kc = (long)(_other + lVar13 * otherStride + (lVar14 - depth));
            local_58 = otherStride;
            pdVar5[-2] = (double)lVar22;
            pdVar5[-3] = 0.0;
            pdVar5[-4] = (double)depth;
            pdVar5[-5] = (double)depth_00;
            pdVar5[-6] = (double)lVar6;
            pdVar5[-7] = 6.78699953954704e-318;
            gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
            ::operator()(&local_32,(blas_data_mapper<double,_long,_0,_0,_1> *)&actual_kc,pLVar4,
                         pdVar25 + lVar13 * depth,lVar22,depth_00,(long)pdVar5[-6],-1.0,
                         (long)pdVar5[-5],(long)pdVar5[-4],(long)pdVar5[-3],(long)pdVar5[-2]);
          }
          lVar19 = lVar19 + 4;
          lVar8 = lVar8 + -4;
          pdVar20 = pdVar20 + -4;
          pdVar11 = pdVar11 + ~triStride * 4;
          pdVar5[-1] = 1.97626258336499e-323;
          depth_00 = (long)pdVar5[-1];
        }
        pdVar10 = pdVar10 + otherStride * lVar17;
      }
      lVar14 = lStack_40 - lVar2;
      lStack_40 = lVar14;
      pdVar10 = _other;
      pdVar11 = local_c0;
      lVar13 = local_c8;
      for (lVar6 = 0; pLVar4 = local_50, lVar6 < lVar14; lVar6 = lVar6 + lVar24) {
        lVar8 = lVar13;
        if (lVar24 <= lVar13) {
          lVar8 = lVar24;
        }
        if (0 < lVar8) {
          actual_kc = (long)pdVar11;
          local_58 = triStride;
          pdVar5[-2] = 0.0;
          pdVar5[-3] = 6.78824952563102e-318;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
          ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&actual_kc,depth,
                       lVar8,0,(long)pdVar5[-2]);
          actual_kc = (long)pdVar10;
          local_58 = otherStride;
          pdVar5[-3] = 0.0;
          pdVar5[-2] = 0.0;
          pdVar5[-4] = -NAN;
          pdVar5[-5] = -NAN;
          pdVar5[-6] = (double)otherSize;
          pLVar4 = local_50;
          pdVar5[-7] = 6.78866454077352e-318;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
          ::operator()(&local_32,(blas_data_mapper<double,_long,_0,_0,_1> *)&actual_kc,pLVar4,
                       pdVar25,lVar8,depth,(long)pdVar5[-6],-1.0,(long)pdVar5[-5],(long)pdVar5[-4],
                       (long)pdVar5[-3],(long)pdVar5[-2]);
          lVar14 = lStack_40;
          pdVar5[-1] = 1.97626258336499e-323;
          depth_00 = (long)pdVar5[-1];
        }
        pdVar11 = pdVar11 + lVar24;
        pdVar10 = pdVar10 + lVar24;
        lVar13 = lVar13 - lVar24;
      }
      pdVar26 = pdVar26 + -lVar2;
      local_d8 = (double *)((long)local_d8 + (triStride * 8 ^ 0xfffffffffffffff8U) * lVar2);
      local_c0 = local_c0 + -(lVar2 * triStride);
      local_c8 = local_c8 - lVar2;
    }
    pdVar5[-1] = 6.78944516449395e-318;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate)
    ;
    pdVar5[-1] = 6.78950445237145e-318;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)&l3);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }